

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

void sysbvm_identityDictionary_increaseCapacity(sysbvm_context_t *context,sysbvm_tuple_t dictionary)

{
  long lVar1;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t association;
  size_t i;
  sysbvm_array_t *newStorage;
  size_t newCapacity;
  size_t oldCapacity;
  sysbvm_array_t *oldStorage;
  sysbvm_dictionary_t *dictionaryObject;
  sysbvm_tuple_t dictionary_local;
  sysbvm_context_t *context_local;
  
  lVar1 = *(long *)(dictionary + 0x18);
  sVar2 = sysbvm_tuple_getSizeInSlots(*(sysbvm_tuple_t *)(dictionary + 0x18));
  newStorage = (sysbvm_array_t *)(sVar2 << 1);
  if (newStorage < (sysbvm_array_t *)0x8) {
    newStorage = (sysbvm_array_t *)0x8;
  }
  sVar3 = sysbvm_array_create(context,(sysbvm_tuple_t)newStorage);
  *(sysbvm_tuple_t *)(dictionary + 0x18) = sVar3;
  for (association = 0; association < sVar2; association = association + 1) {
    sVar3 = *(sysbvm_tuple_t *)(lVar1 + 0x10 + association * 8);
    if (sVar3 != 0) {
      sysbvm_identityDictionary_insertNoCheck(dictionary,sVar3);
    }
  }
  return;
}

Assistant:

static void sysbvm_identityDictionary_increaseCapacity(sysbvm_context_t *context, sysbvm_tuple_t dictionary)
{
    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *oldStorage = (sysbvm_array_t*)dictionaryObject->storage;

    size_t oldCapacity = sysbvm_tuple_getSizeInSlots(dictionaryObject->storage);
    size_t newCapacity = oldCapacity * 2;
    if(newCapacity < 8)
        newCapacity = 8;

    // Make the new storage.
    sysbvm_array_t *newStorage = (sysbvm_array_t*)sysbvm_array_create(context, newCapacity);
    dictionaryObject->storage = (sysbvm_tuple_t)newStorage;

    // Reinsert the old elements.
    for(size_t i = 0; i < oldCapacity; ++i)
    {
        sysbvm_tuple_t association = oldStorage->elements[i];
        if(association)
            sysbvm_identityDictionary_insertNoCheck(dictionary, association);
    }
}